

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::render
          (FramebufferClearCase *this,GLuint program)

{
  ClearType CVar1;
  glUniform4fvFunc p_Var2;
  int iVar3;
  GLint GVar4;
  undefined4 extraout_var;
  GLfloat *pGVar5;
  GLenum GVar6;
  BufferFmtDesc BVar7;
  float clearDepth;
  int clearStencil;
  undefined4 local_68;
  GLfloat aGStack_64 [7];
  Vec3 local_48;
  Vec3 local_38;
  Functions *gl;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  CVar1 = this->m_clearType;
  BVar7 = getBufferFormat(CVar1);
  if (BVar7.colorFmt == 0x8d8e) {
    local_68 = 1;
    aGStack_64[0] = 1.77965e-43;
    aGStack_64[1] = -NAN;
    aGStack_64[2] = 0.0;
    aGStack_64[3] = 1.77965e-43;
  }
  else if (BVar7.colorFmt == 0x8d7c) {
    local_68 = 2;
    aGStack_64[0] = 3.57331e-43;
    aGStack_64[1] = 3.57331e-43;
    aGStack_64[2] = 0.0;
    aGStack_64[3] = 3.57331e-43;
  }
  else {
    local_68 = 0;
    aGStack_64[0] = 1.0;
    aGStack_64[1] = 1.0;
    aGStack_64[2] = 0.5;
    aGStack_64[3] = 1.0;
  }
  clearStencil = 0x7b;
  clearDepth = 0.5;
  switch(CVar1) {
  case CLEAR_COLOR_FIXED:
  case CLEAR_COLOR_FLOAT:
    GVar6 = 0x1800;
    pGVar5 = aGStack_64;
    goto LAB_014d51dd;
  case CLEAR_COLOR_INT:
    GVar6 = 0x1800;
    pGVar5 = aGStack_64;
    goto LAB_014d5211;
  case CLEAR_COLOR_UINT:
    (*gl->clearBufferuiv)(0x1800,0,(GLuint *)aGStack_64);
    break;
  case CLEAR_DEPTH:
    GVar6 = 0x1801;
    pGVar5 = &clearDepth;
LAB_014d51dd:
    (*gl->clearBufferfv)(GVar6,0,pGVar5);
    break;
  case CLEAR_STENCIL:
    GVar6 = 0x1802;
    pGVar5 = (GLfloat *)&clearStencil;
LAB_014d5211:
    (*gl->clearBufferiv)(GVar6,0,(GLint *)pGVar5);
    break;
  case CLEAR_DEPTH_STENCIL:
    (*gl->clearBufferfi)(0x84f9,0,0.5,0x7b);
  }
  CVar1 = this->m_clearType;
  if (CVar1 - CLEAR_STENCIL < 2) {
    if (CVar1 == CLEAR_DEPTH_STENCIL) goto LAB_014d5250;
  }
  else {
    if (CVar1 != CLEAR_DEPTH) {
      return;
    }
LAB_014d5250:
    (*gl->enable)(0xb71);
    if (1 < CVar1 - CLEAR_STENCIL) goto LAB_014d526d;
  }
  (*gl->enable)(0xb90);
LAB_014d526d:
  (*gl->stencilFunc)(0x202,0x7b,0xffffffff);
  (*gl->depthFunc)(0x204);
  (*gl->disable)(0xc11);
  p_Var2 = gl->uniform4fv;
  GVar4 = (*gl->getUniformLocation)(program,"u_color");
  (*p_Var2)(GVar4,1,aGStack_64);
  local_38.m_data[0] = -1.0;
  local_38.m_data[1] = -1.0;
  local_38.m_data[2] = 0.6;
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.6;
  drawQuad(gl,program,&local_38,&local_48);
  return;
}

Assistant:

void FramebufferClearCase::render (GLuint program) const
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const BufferFmtDesc		bufferFmt			= getBufferFormat(m_clearType);
	const Color				clearColor			= getMainColor(bufferFmt);

	const int				clearStencil		= 123;
	const float				clearDepth			= 0.5f;

	switch (m_clearType)
	{
		case CLEAR_COLOR_FIXED:		gl.clearBufferfv (GL_COLOR, 0, clearColor.f);						break;
		case CLEAR_COLOR_FLOAT:		gl.clearBufferfv (GL_COLOR, 0, clearColor.f);						break;
		case CLEAR_COLOR_INT:		gl.clearBufferiv (GL_COLOR, 0, clearColor.i);						break;
		case CLEAR_COLOR_UINT:		gl.clearBufferuiv(GL_COLOR, 0, clearColor.u);						break;
		case CLEAR_DEPTH:			gl.clearBufferfv (GL_DEPTH, 0, &clearDepth);						break;
		case CLEAR_STENCIL:			gl.clearBufferiv (GL_STENCIL, 0, &clearStencil);					break;
		case CLEAR_DEPTH_STENCIL:	gl.clearBufferfi (GL_DEPTH_STENCIL, 0, clearDepth, clearStencil);	break;

		default:
			DE_ASSERT(false);
	}

	const bool useDepth		= (m_clearType == CLEAR_DEPTH   || m_clearType == CLEAR_DEPTH_STENCIL);
	const bool useStencil	= (m_clearType == CLEAR_STENCIL || m_clearType == CLEAR_DEPTH_STENCIL);

	// Render something to expose changes to depth/stencil buffer
	if (useDepth || useStencil)
	{
		if (useDepth)
			gl.enable(GL_DEPTH_TEST);

		if (useStencil)
			gl.enable(GL_STENCIL_TEST);

		gl.stencilFunc(GL_EQUAL, clearStencil, ~0u);
		gl.depthFunc(GL_GREATER);
		gl.disable(GL_SCISSOR_TEST);

		gl.uniform4fv(gl.getUniformLocation(program, "u_color"), 1, clearColor.f);
		drawQuad(gl, program, tcu::Vec3(-1.0f, -1.0f, 0.6f), tcu::Vec3(1.0f, 1.0f, 0.6f));
	}
}